

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O2

void __thiscall
google::protobuf::util::converter::JsonStreamParser::~JsonStreamParser(JsonStreamParser *this)

{
  this->_vptr_JsonStreamParser = (_func_int **)&PTR__JsonStreamParser_003e3da0;
  std::__cxx11::string::~string((string *)&this->utf8_replacement_character_);
  std::__cxx11::string::~string((string *)&this->chunk_storage_);
  std::__cxx11::string::~string((string *)&this->parsed_storage_);
  std::__cxx11::string::~string((string *)&this->key_storage_);
  std::__cxx11::string::~string((string *)&this->leftover_);
  std::
  _Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
  ::~_Deque_base((_Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
                  *)&this->stack_);
  return;
}

Assistant:

JsonStreamParser::~JsonStreamParser() {}